

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.h
# Opt level: O2

void __thiscall runner::runner(runner *this,service *srv)

{
  value *this_00;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  this->srv_ = srv;
  (this->command_)._M_dataplus._M_p = (pointer)&(this->command_).field_2;
  (this->command_)._M_string_length = 0;
  (this->command_).field_2._M_local_buf[0] = '\0';
  this_00 = (value *)cppcms::service::settings();
  std::__cxx11::string::string((string *)&local_50,"none",&local_51);
  cppcms::json::value::get<std::__cxx11::string>(&local_30,this_00,"test.exec",&local_50);
  std::__cxx11::string::operator=((string *)&this->command_,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

runner(cppcms::service &srv) : srv_(&srv)
	{
		command_ = srv.settings().get<std::string>("test.exec","none");
	}